

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QFileInfo>>::
emplace<std::pair<QString,QFileInfo>const&>
          (QMovableArrayOps<std::pair<QString,QFileInfo>> *this,qsizetype i,
          pair<QString,_QFileInfo> *args)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  Data *pDVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  long lVar8;
  pair<QString,_QFileInfo> *__dest;
  long lVar9;
  long in_FS_OFFSET;
  Inserter local_80;
  QArrayData *local_58;
  char16_t *local_50;
  long local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0060e5d0:
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &((args->first).d.d)->super_QArrayData;
    local_50 = (args->first).d.ptr;
    local_48 = (args->first).d.size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (((Data *)local_58)->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((Data *)local_58)->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    QFileInfo::QFileInfo((QFileInfo *)&local_40,&args->second);
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this,
               (uint)(i == 0 && lVar3 != 0),1,(pair<QString,_QFileInfo> **)0x0,
               (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
    lVar8 = local_48;
    pcVar7 = local_50;
    pQVar6 = local_58;
    if (i == 0 && lVar3 != 0) {
      lVar3 = *(long *)(this + 8);
      local_58 = (QArrayData *)0x0;
      *(QArrayData **)(lVar3 + -0x20) = pQVar6;
      local_50 = (char16_t *)0x0;
      *(char16_t **)(lVar3 + -0x18) = pcVar7;
      local_48 = 0;
      *(long *)(lVar3 + -0x10) = lVar8;
      QFileInfo::QFileInfo((QFileInfo *)(lVar3 + -8),(QFileInfo *)&local_40);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    }
    else {
      lVar3 = *(long *)(this + 8);
      lVar9 = i * 0x20;
      plVar1 = (long *)(lVar9 + lVar3);
      __dest = (pair<QString,_QFileInfo> *)(plVar1 + 4);
      local_80.nInserts = 1;
      local_80.bytes = (*(long *)(this + 0x10) - i) * 0x20;
      local_80.data = (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)this;
      local_80.displaceTo = __dest;
      memmove(__dest,(void *)(lVar9 + lVar3),local_80.bytes);
      lVar8 = local_48;
      pcVar7 = local_50;
      pQVar6 = local_58;
      local_58 = (QArrayData *)0x0;
      *plVar1 = (long)pQVar6;
      local_50 = (char16_t *)0x0;
      plVar1[1] = (long)pcVar7;
      local_48 = 0;
      plVar1[2] = lVar8;
      QFileInfo::QFileInfo((QFileInfo *)(lVar9 + lVar3 + 0x18),(QFileInfo *)&local_40);
      local_80.displaceFrom = __dest;
      QMovableArrayOps<std::pair<QString,_QFileInfo>_>::Inserter::~Inserter(&local_80);
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_40);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 5) + i)) {
      lVar8 = i * 0x20;
      pDVar5 = (args->first).d.d;
      *(Data **)(lVar3 + lVar8) = pDVar5;
      *(char16_t **)(lVar3 + 8 + lVar8) = (args->first).d.ptr;
      *(qsizetype *)(lVar3 + 0x10 + lVar8) = (args->first).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QFileInfo::QFileInfo((QFileInfo *)(lVar3 + lVar8 + 0x18),&args->second);
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_0060e5d0;
      pDVar5 = (args->first).d.d;
      *(Data **)(uVar4 - 0x20) = pDVar5;
      *(char16_t **)(uVar4 - 0x18) = (args->first).d.ptr;
      *(qsizetype *)(uVar4 - 0x10) = (args->first).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QFileInfo::QFileInfo((QFileInfo *)(uVar4 - 8),&args->second);
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }